

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_t * matd_select(matd_t *a,int r0,int r1,int c0,int c1)

{
  uint uVar1;
  matd_t *pmVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0xa8,"matd_t *matd_select(const matd_t *, int, int, int, int)");
  }
  if ((-1 < r0) && ((uint)r0 < a->nrows)) {
    if ((-1 < c0) && ((uint)c0 < a->ncols)) {
      pmVar2 = matd_create((r1 - r0) + 1,(c1 - c0) + 1);
      if (r0 <= r1) {
        iVar3 = 0;
        do {
          if (c0 <= c1) {
            uVar1 = a->ncols;
            uVar4 = pmVar2->ncols * iVar3;
            iVar5 = c0;
            do {
              pmVar2[(ulong)uVar4 + 1] = a[(ulong)(uVar1 * r0 + iVar5) + 1];
              uVar4 = uVar4 + 1;
              bVar6 = iVar5 < c1;
              iVar5 = iVar5 + 1;
            } while (bVar6);
          }
          iVar3 = iVar3 + 1;
          bVar6 = r0 != r1;
          r0 = r0 + 1;
        } while (bVar6);
      }
      return pmVar2;
    }
    __assert_fail("c0 >= 0 && c0 < a->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0xab,"matd_t *matd_select(const matd_t *, int, int, int, int)");
  }
  __assert_fail("r0 >= 0 && r0 < a->nrows",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0xaa,"matd_t *matd_select(const matd_t *, int, int, int, int)");
}

Assistant:

matd_t *matd_select(const matd_t * a, int r0, int r1, int c0, int c1)
{
    assert(a != NULL);

    assert(r0 >= 0 && r0 < a->nrows);
    assert(c0 >= 0 && c0 < a->ncols);

    int nrows = r1 - r0 + 1;
    int ncols = c1 - c0 + 1;

    matd_t * r = matd_create(nrows, ncols);

    for (int row = r0; row <= r1; row++)
        for (int col = c0; col <= c1; col++)
            MATD_EL(r,row-r0,col-c0) = MATD_EL(a,row,col);

    return r;
}